

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint16_avx512.h
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_1,_false,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::ObjectIntersectorK<16,_false>_>,_false>
     ::intersectCoherent(vint<16> *valid_i,Intersectors *This,RayHitK<16> *ray,
                        RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  ulong *puVar2;
  undefined1 (*pauVar3) [16];
  uint uVar4;
  AccelData *pAVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  _func_int **pp_Var18;
  ulong *puVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar53 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  float fVar61;
  undefined4 uVar62;
  undefined1 in_ZMM0 [64];
  float fVar63;
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  int in_XMM11_Da;
  int in_XMM11_Db;
  int in_XMM11_Dc;
  int in_XMM11_Dd;
  int in_YMM11_H;
  int in_register_000014d4;
  int in_register_000014d8;
  int in_register_000014dc;
  int in_register_000014e0;
  int in_register_000014e4;
  int in_register_000014e8;
  int in_register_000014ec;
  int in_register_000014f0;
  int in_register_000014f4;
  int in_register_000014f8;
  int in_register_000014fc;
  int in_XMM12_Da;
  int in_XMM12_Db;
  int in_XMM12_Dc;
  int in_XMM12_Dd;
  int in_YMM12_H;
  int in_register_00001514;
  int in_register_00001518;
  int in_register_0000151c;
  int in_register_00001520;
  int in_register_00001524;
  int in_register_00001528;
  int in_register_0000152c;
  int in_register_00001530;
  int in_register_00001534;
  int in_register_00001538;
  int in_register_0000153c;
  int in_XMM13_Da;
  int in_XMM13_Db;
  int in_XMM13_Dc;
  int in_XMM13_Dd;
  int in_YMM13_H;
  int in_register_00001554;
  int in_register_00001558;
  int in_register_0000155c;
  int in_register_00001560;
  int in_register_00001564;
  int in_register_00001568;
  int in_register_0000156c;
  int in_register_00001570;
  int in_register_00001574;
  int in_register_00001578;
  int in_register_0000157c;
  undefined1 in_ZMM17 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  vfloat<8> fmin;
  vint<16> mask;
  vint<16> octant;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2a00 [16];
  RTCIntersectFunctionNArguments local_29a0;
  Geometry *local_2970;
  undefined8 local_2968;
  RTCIntersectArguments *local_2960;
  undefined1 local_2940 [64];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [64];
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  undefined1 local_2680 [64];
  undefined1 local_2640 [64];
  undefined1 local_2600 [64];
  undefined1 local_25c0 [64];
  undefined1 local_2580 [64];
  undefined1 local_2540 [64];
  undefined1 local_2500 [64];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  ulong local_23c0;
  undefined4 local_23b8 [2];
  ulong local_23b0 [1136];
  
  auVar42 = vpternlogd_avx512f(in_ZMM0,in_ZMM0,in_ZMM0,0xff);
  uVar20 = vpcmpeqd_avx512f(auVar42,(undefined1  [64])valid_i->field_0);
  if ((short)uVar20 != 0) {
    pAVar5 = This->ptr;
    auVar51 = *(undefined1 (*) [64])(ray + 0x100);
    auVar43 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
    auVar44 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
    auVar45 = vandps_avx512dq(auVar51,auVar43);
    uVar24 = vcmpps_avx512f(auVar45,auVar44,1);
    auVar45 = vblendmps_avx512f(auVar51,auVar44);
    bVar14 = (bool)((byte)uVar24 & 1);
    auVar48._0_4_ = (uint)bVar14 * auVar45._0_4_ | (uint)!bVar14 * in_XMM11_Da;
    bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar48._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * in_XMM11_Db;
    bVar14 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar48._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * in_XMM11_Dc;
    bVar14 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar48._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * in_XMM11_Dd;
    bVar14 = (bool)((byte)(uVar24 >> 4) & 1);
    auVar48._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * in_YMM11_H;
    bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
    auVar48._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * in_register_000014d4;
    bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
    auVar48._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * in_register_000014d8;
    bVar14 = (bool)((byte)(uVar24 >> 7) & 1);
    auVar48._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * in_register_000014dc;
    bVar14 = (bool)((byte)(uVar24 >> 8) & 1);
    auVar48._32_4_ = (uint)bVar14 * auVar45._32_4_ | (uint)!bVar14 * in_register_000014e0;
    bVar14 = (bool)((byte)(uVar24 >> 9) & 1);
    auVar48._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * in_register_000014e4;
    bVar14 = (bool)((byte)(uVar24 >> 10) & 1);
    auVar48._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * in_register_000014e8;
    bVar14 = (bool)((byte)(uVar24 >> 0xb) & 1);
    auVar48._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * in_register_000014ec;
    bVar14 = (bool)((byte)(uVar24 >> 0xc) & 1);
    auVar48._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * in_register_000014f0;
    bVar14 = (bool)((byte)(uVar24 >> 0xd) & 1);
    auVar48._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * in_register_000014f4;
    bVar14 = (bool)((byte)(uVar24 >> 0xe) & 1);
    auVar48._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * in_register_000014f8;
    bVar14 = SUB81(uVar24 >> 0xf,0);
    auVar48._60_4_ = (uint)bVar14 * auVar45._60_4_ | (uint)!bVar14 * in_register_000014fc;
    auVar45 = *(undefined1 (*) [64])(ray + 0x140);
    auVar46 = vandps_avx512dq(auVar45,auVar43);
    uVar24 = vcmpps_avx512f(auVar46,auVar44,1);
    auVar46 = vblendmps_avx512f(auVar45,auVar44);
    bVar14 = (bool)((byte)uVar24 & 1);
    auVar49._0_4_ = (uint)bVar14 * auVar46._0_4_ | (uint)!bVar14 * in_XMM12_Da;
    bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar49._4_4_ = (uint)bVar14 * auVar46._4_4_ | (uint)!bVar14 * in_XMM12_Db;
    bVar14 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar49._8_4_ = (uint)bVar14 * auVar46._8_4_ | (uint)!bVar14 * in_XMM12_Dc;
    bVar14 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar49._12_4_ = (uint)bVar14 * auVar46._12_4_ | (uint)!bVar14 * in_XMM12_Dd;
    bVar14 = (bool)((byte)(uVar24 >> 4) & 1);
    auVar49._16_4_ = (uint)bVar14 * auVar46._16_4_ | (uint)!bVar14 * in_YMM12_H;
    bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
    auVar49._20_4_ = (uint)bVar14 * auVar46._20_4_ | (uint)!bVar14 * in_register_00001514;
    bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
    auVar49._24_4_ = (uint)bVar14 * auVar46._24_4_ | (uint)!bVar14 * in_register_00001518;
    bVar14 = (bool)((byte)(uVar24 >> 7) & 1);
    auVar49._28_4_ = (uint)bVar14 * auVar46._28_4_ | (uint)!bVar14 * in_register_0000151c;
    bVar14 = (bool)((byte)(uVar24 >> 8) & 1);
    auVar49._32_4_ = (uint)bVar14 * auVar46._32_4_ | (uint)!bVar14 * in_register_00001520;
    bVar14 = (bool)((byte)(uVar24 >> 9) & 1);
    auVar49._36_4_ = (uint)bVar14 * auVar46._36_4_ | (uint)!bVar14 * in_register_00001524;
    bVar14 = (bool)((byte)(uVar24 >> 10) & 1);
    auVar49._40_4_ = (uint)bVar14 * auVar46._40_4_ | (uint)!bVar14 * in_register_00001528;
    bVar14 = (bool)((byte)(uVar24 >> 0xb) & 1);
    auVar49._44_4_ = (uint)bVar14 * auVar46._44_4_ | (uint)!bVar14 * in_register_0000152c;
    bVar14 = (bool)((byte)(uVar24 >> 0xc) & 1);
    auVar49._48_4_ = (uint)bVar14 * auVar46._48_4_ | (uint)!bVar14 * in_register_00001530;
    bVar14 = (bool)((byte)(uVar24 >> 0xd) & 1);
    auVar49._52_4_ = (uint)bVar14 * auVar46._52_4_ | (uint)!bVar14 * in_register_00001534;
    bVar14 = (bool)((byte)(uVar24 >> 0xe) & 1);
    auVar49._56_4_ = (uint)bVar14 * auVar46._56_4_ | (uint)!bVar14 * in_register_00001538;
    bVar14 = SUB81(uVar24 >> 0xf,0);
    auVar49._60_4_ = (uint)bVar14 * auVar46._60_4_ | (uint)!bVar14 * in_register_0000153c;
    auVar46 = *(undefined1 (*) [64])(ray + 0x180);
    auVar43 = vandps_avx512dq(auVar46,auVar43);
    uVar24 = vcmpps_avx512f(auVar43,auVar44,1);
    auVar43 = vrcp14ps_avx512f(auVar48);
    auVar44 = vblendmps_avx512f(auVar46,auVar44);
    bVar14 = (bool)((byte)uVar24 & 1);
    auVar50._0_4_ = (uint)bVar14 * auVar44._0_4_ | (uint)!bVar14 * in_XMM13_Da;
    bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar50._4_4_ = (uint)bVar14 * auVar44._4_4_ | (uint)!bVar14 * in_XMM13_Db;
    bVar14 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar50._8_4_ = (uint)bVar14 * auVar44._8_4_ | (uint)!bVar14 * in_XMM13_Dc;
    bVar14 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar50._12_4_ = (uint)bVar14 * auVar44._12_4_ | (uint)!bVar14 * in_XMM13_Dd;
    bVar14 = (bool)((byte)(uVar24 >> 4) & 1);
    auVar50._16_4_ = (uint)bVar14 * auVar44._16_4_ | (uint)!bVar14 * in_YMM13_H;
    bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
    auVar50._20_4_ = (uint)bVar14 * auVar44._20_4_ | (uint)!bVar14 * in_register_00001554;
    bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
    auVar50._24_4_ = (uint)bVar14 * auVar44._24_4_ | (uint)!bVar14 * in_register_00001558;
    bVar14 = (bool)((byte)(uVar24 >> 7) & 1);
    auVar50._28_4_ = (uint)bVar14 * auVar44._28_4_ | (uint)!bVar14 * in_register_0000155c;
    bVar14 = (bool)((byte)(uVar24 >> 8) & 1);
    auVar50._32_4_ = (uint)bVar14 * auVar44._32_4_ | (uint)!bVar14 * in_register_00001560;
    bVar14 = (bool)((byte)(uVar24 >> 9) & 1);
    auVar50._36_4_ = (uint)bVar14 * auVar44._36_4_ | (uint)!bVar14 * in_register_00001564;
    bVar14 = (bool)((byte)(uVar24 >> 10) & 1);
    auVar50._40_4_ = (uint)bVar14 * auVar44._40_4_ | (uint)!bVar14 * in_register_00001568;
    bVar14 = (bool)((byte)(uVar24 >> 0xb) & 1);
    auVar50._44_4_ = (uint)bVar14 * auVar44._44_4_ | (uint)!bVar14 * in_register_0000156c;
    bVar14 = (bool)((byte)(uVar24 >> 0xc) & 1);
    auVar50._48_4_ = (uint)bVar14 * auVar44._48_4_ | (uint)!bVar14 * in_register_00001570;
    bVar14 = (bool)((byte)(uVar24 >> 0xd) & 1);
    auVar50._52_4_ = (uint)bVar14 * auVar44._52_4_ | (uint)!bVar14 * in_register_00001574;
    bVar14 = (bool)((byte)(uVar24 >> 0xe) & 1);
    auVar50._56_4_ = (uint)bVar14 * auVar44._56_4_ | (uint)!bVar14 * in_register_00001578;
    bVar14 = SUB81(uVar24 >> 0xf,0);
    auVar50._60_4_ = (uint)bVar14 * auVar44._60_4_ | (uint)!bVar14 * in_register_0000157c;
    auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar47 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar44 = vfnmadd213ps_avx512f(auVar48,auVar43,auVar47);
    auVar43 = vfmadd132ps_avx512f(auVar44,auVar43,auVar43);
    auVar44 = vrcp14ps_avx512f(auVar49);
    auVar48 = vfnmadd213ps_avx512f(auVar49,auVar44,auVar47);
    auVar44 = vfmadd132ps_avx512f(auVar48,auVar44,auVar44);
    auVar48 = vrcp14ps_avx512f(auVar50);
    auVar49 = vfnmadd213ps_avx512f(auVar50,auVar48,auVar47);
    auVar48 = vfmadd132ps_avx512f(auVar49,auVar48,auVar48);
    local_26c0 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar64);
    local_2700 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar64);
    uVar17 = vcmpps_avx512f(auVar51,auVar64,1);
    auVar49 = vpmovm2d_avx512dq(uVar17);
    auVar49 = vpsrld_avx512f(auVar49,0x1f);
    uVar24 = vcmpps_avx512f(auVar45,auVar64,1);
    auVar45._8_4_ = 2;
    auVar45._0_8_ = 0x200000002;
    auVar45._12_4_ = 2;
    auVar45._16_4_ = 2;
    auVar45._20_4_ = 2;
    auVar45._24_4_ = 2;
    auVar45._28_4_ = 2;
    auVar45._32_4_ = 2;
    auVar45._36_4_ = 2;
    auVar45._40_4_ = 2;
    auVar45._44_4_ = 2;
    auVar45._48_4_ = 2;
    auVar45._52_4_ = 2;
    auVar45._56_4_ = 2;
    auVar45._60_4_ = 2;
    auVar45 = vpord_avx512f(auVar49,auVar45);
    bVar14 = (bool)((byte)uVar24 & 1);
    auVar47._0_4_ = (uint)bVar14 * auVar45._0_4_ | (uint)!bVar14 * auVar49._0_4_;
    bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar47._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * auVar49._4_4_;
    bVar14 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar47._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * auVar49._8_4_;
    bVar14 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar47._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * auVar49._12_4_;
    bVar14 = (bool)((byte)(uVar24 >> 4) & 1);
    auVar47._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * auVar49._16_4_;
    bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
    auVar47._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * auVar49._20_4_;
    bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
    auVar47._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * auVar49._24_4_;
    bVar14 = (bool)((byte)(uVar24 >> 7) & 1);
    auVar47._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * auVar49._28_4_;
    bVar14 = (bool)((byte)(uVar24 >> 8) & 1);
    auVar47._32_4_ = (uint)bVar14 * auVar45._32_4_ | (uint)!bVar14 * auVar49._32_4_;
    bVar14 = (bool)((byte)(uVar24 >> 9) & 1);
    auVar47._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * auVar49._36_4_;
    bVar14 = (bool)((byte)(uVar24 >> 10) & 1);
    auVar47._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * auVar49._40_4_;
    bVar14 = (bool)((byte)(uVar24 >> 0xb) & 1);
    auVar47._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * auVar49._44_4_;
    bVar14 = (bool)((byte)(uVar24 >> 0xc) & 1);
    auVar47._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * auVar49._48_4_;
    bVar14 = (bool)((byte)(uVar24 >> 0xd) & 1);
    auVar47._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * auVar49._52_4_;
    bVar14 = (bool)((byte)(uVar24 >> 0xe) & 1);
    auVar47._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * auVar49._56_4_;
    bVar14 = SUB81(uVar24 >> 0xf,0);
    auVar47._60_4_ = (uint)bVar14 * auVar45._60_4_ | (uint)!bVar14 * auVar49._60_4_;
    uVar24 = vcmpps_avx512f(auVar46,auVar64,1);
    auVar46._8_4_ = 4;
    auVar46._0_8_ = 0x400000004;
    auVar46._12_4_ = 4;
    auVar46._16_4_ = 4;
    auVar46._20_4_ = 4;
    auVar46._24_4_ = 4;
    auVar46._28_4_ = 4;
    auVar46._32_4_ = 4;
    auVar46._36_4_ = 4;
    auVar46._40_4_ = 4;
    auVar46._44_4_ = 4;
    auVar46._48_4_ = 4;
    auVar46._52_4_ = 4;
    auVar46._56_4_ = 4;
    auVar46._60_4_ = 4;
    auVar45 = vpord_avx512f(auVar47,auVar46);
    bVar14 = (bool)((byte)uVar24 & 1);
    auVar64._0_4_ = (uint)bVar14 * auVar45._0_4_ | !bVar14 * auVar47._0_4_;
    bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar64._4_4_ = (uint)bVar14 * auVar45._4_4_ | !bVar14 * auVar47._4_4_;
    bVar14 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar64._8_4_ = (uint)bVar14 * auVar45._8_4_ | !bVar14 * auVar47._8_4_;
    bVar14 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar64._12_4_ = (uint)bVar14 * auVar45._12_4_ | !bVar14 * auVar47._12_4_;
    bVar14 = (bool)((byte)(uVar24 >> 4) & 1);
    auVar64._16_4_ = (uint)bVar14 * auVar45._16_4_ | !bVar14 * auVar47._16_4_;
    bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
    auVar64._20_4_ = (uint)bVar14 * auVar45._20_4_ | !bVar14 * auVar47._20_4_;
    bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
    auVar64._24_4_ = (uint)bVar14 * auVar45._24_4_ | !bVar14 * auVar47._24_4_;
    bVar14 = (bool)((byte)(uVar24 >> 7) & 1);
    auVar64._28_4_ = (uint)bVar14 * auVar45._28_4_ | !bVar14 * auVar47._28_4_;
    bVar14 = (bool)((byte)(uVar24 >> 8) & 1);
    auVar64._32_4_ = (uint)bVar14 * auVar45._32_4_ | !bVar14 * auVar47._32_4_;
    bVar14 = (bool)((byte)(uVar24 >> 9) & 1);
    auVar64._36_4_ = (uint)bVar14 * auVar45._36_4_ | !bVar14 * auVar47._36_4_;
    bVar14 = (bool)((byte)(uVar24 >> 10) & 1);
    auVar64._40_4_ = (uint)bVar14 * auVar45._40_4_ | !bVar14 * auVar47._40_4_;
    bVar14 = (bool)((byte)(uVar24 >> 0xb) & 1);
    auVar64._44_4_ = (uint)bVar14 * auVar45._44_4_ | !bVar14 * auVar47._44_4_;
    bVar14 = (bool)((byte)(uVar24 >> 0xc) & 1);
    auVar64._48_4_ = (uint)bVar14 * auVar45._48_4_ | !bVar14 * auVar47._48_4_;
    bVar14 = (bool)((byte)(uVar24 >> 0xd) & 1);
    auVar64._52_4_ = (uint)bVar14 * auVar45._52_4_ | !bVar14 * auVar47._52_4_;
    bVar14 = (bool)((byte)(uVar24 >> 0xe) & 1);
    auVar64._56_4_ = (uint)bVar14 * auVar45._56_4_ | !bVar14 * auVar47._56_4_;
    bVar14 = SUB81(uVar24 >> 0xf,0);
    auVar64._60_4_ = (uint)bVar14 * auVar45._60_4_ | !bVar14 * auVar47._60_4_;
    auVar45 = vmovdqa32_avx512f(auVar64);
    bVar14 = (bool)((byte)uVar20 & 1);
    auVar67._0_4_ = (uint)bVar14 * auVar45._0_4_ | (uint)!bVar14 * auVar42._0_4_;
    bVar14 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar67._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * auVar42._4_4_;
    bVar14 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar67._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * auVar42._8_4_;
    bVar14 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar67._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * auVar42._12_4_;
    bVar14 = (bool)((byte)(uVar20 >> 4) & 1);
    auVar67._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * auVar42._16_4_;
    bVar14 = (bool)((byte)(uVar20 >> 5) & 1);
    auVar67._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * auVar42._20_4_;
    bVar14 = (bool)((byte)(uVar20 >> 6) & 1);
    auVar67._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * auVar42._24_4_;
    bVar14 = (bool)((byte)(uVar20 >> 7) & 1);
    auVar67._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * auVar42._28_4_;
    bVar14 = (bool)((byte)(uVar20 >> 8) & 1);
    auVar67._32_4_ = (uint)bVar14 * auVar45._32_4_ | (uint)!bVar14 * auVar42._32_4_;
    bVar14 = (bool)((byte)(uVar20 >> 9) & 1);
    auVar67._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * auVar42._36_4_;
    bVar14 = (bool)((byte)(uVar20 >> 10) & 1);
    auVar67._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * auVar42._40_4_;
    bVar14 = (bool)((byte)(uVar20 >> 0xb) & 1);
    auVar67._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * auVar42._44_4_;
    bVar14 = (bool)((byte)(uVar20 >> 0xc) & 1);
    auVar67._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * auVar42._48_4_;
    bVar14 = (bool)((byte)(uVar20 >> 0xd) & 1);
    auVar67._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * auVar42._52_4_;
    bVar14 = (bool)((byte)(uVar20 >> 0xe) & 1);
    auVar67._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * auVar42._56_4_;
    bVar14 = SUB81(uVar20 >> 0xf,0);
    auVar67._60_4_ = (uint)bVar14 * auVar45._60_4_ | (uint)!bVar14 * auVar42._60_4_;
    local_2740 = vmovdqa64_avx512f(auVar67);
    auVar42 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    local_2600 = *(undefined1 (*) [64])ray;
    auVar45 = vxorps_avx512dq(*(undefined1 (*) [64])ray,auVar42);
    auVar45 = vmulps_avx512f(auVar43,auVar45);
    local_2640 = *(undefined1 (*) [64])(ray + 0x40);
    auVar46 = vxorps_avx512dq(*(undefined1 (*) [64])(ray + 0x40),auVar42);
    auVar46 = vmulps_avx512f(auVar44,auVar46);
    local_2680 = *(undefined1 (*) [64])(ray + 0x80);
    auVar42 = vxorps_avx512dq(*(undefined1 (*) [64])(ray + 0x80),auVar42);
    auVar42 = vmulps_avx512f(auVar48,auVar42);
    auVar49 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
    local_2480 = auVar43;
    local_24c0 = auVar44;
    local_2500 = auVar48;
    local_2540 = auVar45;
    local_2580 = auVar46;
    local_25c0 = auVar42;
    do {
      lVar21 = 0;
      for (uVar24 = uVar20; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      auVar50 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_2740 + lVar21 * 4)));
      uVar26 = vpcmpeqd_avx512f(auVar50,local_2740);
      uVar20 = ~CONCAT44((int)((ulong)lVar21 >> 0x20),(uint)(ushort)uVar26) & uVar20;
      auVar47 = vblendmps_avx512f(auVar49,local_2600);
      bVar13 = (byte)uVar26;
      auVar68._0_4_ = (uint)(bVar13 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar50._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar68._4_4_ = (uint)bVar14 * auVar47._4_4_ | (uint)!bVar14 * auVar50._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar68._8_4_ = (uint)bVar14 * auVar47._8_4_ | (uint)!bVar14 * auVar50._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar68._12_4_ = (uint)bVar14 * auVar47._12_4_ | (uint)!bVar14 * auVar50._12_4_;
      bVar14 = (bool)((byte)(uVar26 >> 4) & 1);
      auVar68._16_4_ = (uint)bVar14 * auVar47._16_4_ | (uint)!bVar14 * auVar50._16_4_;
      bVar14 = (bool)((byte)(uVar26 >> 5) & 1);
      auVar68._20_4_ = (uint)bVar14 * auVar47._20_4_ | (uint)!bVar14 * auVar50._20_4_;
      bVar14 = (bool)((byte)(uVar26 >> 6) & 1);
      auVar68._24_4_ = (uint)bVar14 * auVar47._24_4_ | (uint)!bVar14 * auVar50._24_4_;
      bVar14 = (bool)((byte)(uVar26 >> 7) & 1);
      auVar68._28_4_ = (uint)bVar14 * auVar47._28_4_ | (uint)!bVar14 * auVar50._28_4_;
      bVar15 = (byte)(uVar26 >> 8);
      auVar68._32_4_ =
           (uint)(bVar15 & 1) * auVar47._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar50._32_4_;
      bVar14 = (bool)((byte)(uVar26 >> 9) & 1);
      auVar68._36_4_ = (uint)bVar14 * auVar47._36_4_ | (uint)!bVar14 * auVar50._36_4_;
      bVar14 = (bool)((byte)(uVar26 >> 10) & 1);
      auVar68._40_4_ = (uint)bVar14 * auVar47._40_4_ | (uint)!bVar14 * auVar50._40_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xb) & 1);
      auVar68._44_4_ = (uint)bVar14 * auVar47._44_4_ | (uint)!bVar14 * auVar50._44_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xc) & 1);
      auVar68._48_4_ = (uint)bVar14 * auVar47._48_4_ | (uint)!bVar14 * auVar50._48_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xd) & 1);
      auVar68._52_4_ = (uint)bVar14 * auVar47._52_4_ | (uint)!bVar14 * auVar50._52_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xe) & 1);
      auVar68._56_4_ = (uint)bVar14 * auVar47._56_4_ | (uint)!bVar14 * auVar50._56_4_;
      bVar14 = SUB81(uVar26 >> 0xf,0);
      auVar68._60_4_ = (uint)bVar14 * auVar47._60_4_ | (uint)!bVar14 * auVar50._60_4_;
      auVar50 = vshufps_avx512f(auVar68,auVar68,0xb1);
      auVar50 = vminps_avx512f(auVar68,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vminps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vminps_avx512f(auVar50,auVar47);
      auVar30 = vextractf32x4_avx512f(auVar50,2);
      auVar47 = vblendmps_avx512f(auVar49,local_2640);
      auVar69._0_4_ = (uint)(bVar13 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar51._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar69._4_4_ = (uint)bVar14 * auVar47._4_4_ | (uint)!bVar14 * auVar51._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar69._8_4_ = (uint)bVar14 * auVar47._8_4_ | (uint)!bVar14 * auVar51._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar69._12_4_ = (uint)bVar14 * auVar47._12_4_ | (uint)!bVar14 * auVar51._12_4_;
      bVar14 = (bool)((byte)(uVar26 >> 4) & 1);
      auVar69._16_4_ = (uint)bVar14 * auVar47._16_4_ | (uint)!bVar14 * auVar51._16_4_;
      bVar14 = (bool)((byte)(uVar26 >> 5) & 1);
      auVar69._20_4_ = (uint)bVar14 * auVar47._20_4_ | (uint)!bVar14 * auVar51._20_4_;
      bVar14 = (bool)((byte)(uVar26 >> 6) & 1);
      auVar69._24_4_ = (uint)bVar14 * auVar47._24_4_ | (uint)!bVar14 * auVar51._24_4_;
      bVar14 = (bool)((byte)(uVar26 >> 7) & 1);
      auVar69._28_4_ = (uint)bVar14 * auVar47._28_4_ | (uint)!bVar14 * auVar51._28_4_;
      auVar69._32_4_ =
           (uint)(bVar15 & 1) * auVar47._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar51._32_4_;
      bVar14 = (bool)((byte)(uVar26 >> 9) & 1);
      auVar69._36_4_ = (uint)bVar14 * auVar47._36_4_ | (uint)!bVar14 * auVar51._36_4_;
      bVar14 = (bool)((byte)(uVar26 >> 10) & 1);
      auVar69._40_4_ = (uint)bVar14 * auVar47._40_4_ | (uint)!bVar14 * auVar51._40_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xb) & 1);
      auVar69._44_4_ = (uint)bVar14 * auVar47._44_4_ | (uint)!bVar14 * auVar51._44_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xc) & 1);
      auVar69._48_4_ = (uint)bVar14 * auVar47._48_4_ | (uint)!bVar14 * auVar51._48_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xd) & 1);
      auVar69._52_4_ = (uint)bVar14 * auVar47._52_4_ | (uint)!bVar14 * auVar51._52_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xe) & 1);
      auVar69._56_4_ = (uint)bVar14 * auVar47._56_4_ | (uint)!bVar14 * auVar51._56_4_;
      bVar14 = SUB81(uVar26 >> 0xf,0);
      auVar69._60_4_ = (uint)bVar14 * auVar47._60_4_ | (uint)!bVar14 * auVar51._60_4_;
      auVar30 = vminps_avx(auVar50._0_16_,auVar30);
      auVar51 = vshufps_avx512f(auVar69,auVar69,0xb1);
      auVar51 = vminps_avx512f(auVar69,auVar51);
      auVar50 = vshufpd_avx512f(auVar51,auVar51,0x55);
      auVar51 = vminps_avx512f(auVar51,auVar50);
      auVar50 = vpermpd_avx512f(auVar51,0x4e);
      auVar51 = vminps_avx512f(auVar51,auVar50);
      auVar31 = vextractf32x4_avx512f(auVar51,2);
      auVar31 = vminps_avx(auVar51._0_16_,auVar31);
      auVar32 = vunpcklps_avx(auVar30,auVar31);
      auVar51 = vblendmps_avx512f(auVar49,local_2680);
      auVar70._0_4_ = (uint)(bVar13 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar31._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar70._4_4_ = (uint)bVar14 * auVar51._4_4_ | (uint)!bVar14 * auVar31._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar70._8_4_ = (uint)bVar14 * auVar51._8_4_ | (uint)!bVar14 * auVar31._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar70._12_4_ = (uint)bVar14 * auVar51._12_4_ | (uint)!bVar14 * auVar31._12_4_;
      auVar70._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar51._16_4_;
      auVar70._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar51._20_4_;
      auVar70._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar51._24_4_;
      auVar70._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar51._28_4_;
      auVar70._32_4_ = (uint)(bVar15 & 1) * auVar51._32_4_;
      auVar70._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar51._36_4_;
      auVar70._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar51._40_4_;
      auVar70._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar51._44_4_;
      auVar70._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar51._48_4_;
      auVar70._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar51._52_4_;
      auVar70._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar51._56_4_;
      auVar70._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar51._60_4_;
      auVar51 = vshufps_avx512f(auVar70,auVar70,0xb1);
      auVar51 = vminps_avx512f(auVar70,auVar51);
      auVar50 = vshufpd_avx512f(auVar51,auVar51,0x55);
      auVar51 = vminps_avx512f(auVar51,auVar50);
      auVar50 = vpermpd_avx512f(auVar51,0x4e);
      auVar51 = vminps_avx512f(auVar51,auVar50);
      auVar30 = vextractf32x4_avx512f(auVar51,2);
      auVar30 = vminps_avx(auVar51._0_16_,auVar30);
      auVar30 = vinsertps_avx(auVar32,auVar30,0x28);
      auVar51 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar50 = vblendmps_avx512f(auVar51,local_2600);
      auVar71._0_4_ = (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar32._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar71._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar32._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar71._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar32._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar71._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar32._12_4_;
      auVar71._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar71._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar71._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar71._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar71._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar71._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar71._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar71._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar71._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar71._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar71._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar71._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar50 = vshufps_avx512f(auVar71,auVar71,0xb1);
      auVar50 = vmaxps_avx512f(auVar71,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar32 = vextractf32x4_avx512f(auVar50,2);
      auVar31 = vmaxps_avx(auVar50._0_16_,auVar32);
      auVar50 = vblendmps_avx512f(auVar51,local_2640);
      auVar72._0_4_ = (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar32._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar72._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar32._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar72._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar32._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar72._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar32._12_4_;
      auVar72._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar72._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar72._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar72._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar72._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar72._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar72._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar72._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar72._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar72._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar72._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar72._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar50 = vshufps_avx512f(auVar72,auVar72,0xb1);
      auVar50 = vmaxps_avx512f(auVar72,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar32 = vextractf32x4_avx512f(auVar50,2);
      auVar32 = vmaxps_avx(auVar50._0_16_,auVar32);
      auVar33 = vunpcklps_avx(auVar31,auVar32);
      auVar50 = vblendmps_avx512f(auVar51,local_2680);
      auVar73._0_4_ = (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar32._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar73._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar32._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar73._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar32._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar73._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar32._12_4_;
      auVar73._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar73._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar73._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar73._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar73._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar73._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar73._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar73._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar73._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar73._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar73._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar73._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar50 = vshufps_avx512f(auVar73,auVar73,0xb1);
      auVar50 = vmaxps_avx512f(auVar73,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar32 = vextractf32x4_avx512f(auVar50,2);
      auVar31 = vmaxps_avx(auVar50._0_16_,auVar32);
      auVar50 = vblendmps_avx512f(auVar49,auVar43);
      auVar74._0_4_ = (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar32._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar74._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar32._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar74._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar32._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar74._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar32._12_4_;
      auVar74._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar74._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar74._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar74._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar74._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar74._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar74._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar74._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar74._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar74._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar74._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar74._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar31 = vinsertps_avx(auVar33,auVar31,0x28);
      auVar50 = vshufps_avx512f(auVar74,auVar74,0xb1);
      auVar50 = vminps_avx512f(auVar74,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vminps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vminps_avx512f(auVar50,auVar47);
      auVar33 = vextractf32x4_avx512f(auVar50,2);
      auVar32 = vminps_avx(auVar50._0_16_,auVar33);
      auVar50 = vblendmps_avx512f(auVar49,auVar44);
      auVar75._0_4_ = (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar33._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar75._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar33._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar75._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar33._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar75._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar33._12_4_;
      auVar75._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar75._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar75._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar75._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar75._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar75._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar75._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar75._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar75._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar75._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar75._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar75._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar50 = vshufps_avx512f(auVar75,auVar75,0xb1);
      auVar50 = vminps_avx512f(auVar75,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vminps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vminps_avx512f(auVar50,auVar47);
      auVar33 = vextractf32x4_avx512f(auVar50,2);
      auVar33 = vminps_avx(auVar50._0_16_,auVar33);
      auVar32 = vunpcklps_avx(auVar32,auVar33);
      auVar50 = vblendmps_avx512f(auVar49,auVar48);
      auVar76._0_4_ = (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar33._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar76._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar33._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar76._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar33._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar76._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar33._12_4_;
      auVar76._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar76._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar76._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar76._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar76._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar76._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar76._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar76._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar76._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar76._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar76._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar76._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar50 = vshufps_avx512f(auVar76,auVar76,0xb1);
      auVar50 = vminps_avx512f(auVar76,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vminps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vminps_avx512f(auVar50,auVar47);
      auVar33 = vextractf32x4_avx512f(auVar50,2);
      auVar33 = vminps_avx(auVar50._0_16_,auVar33);
      auVar32 = vinsertps_avx(auVar32,auVar33,0x28);
      auVar50 = vblendmps_avx512f(auVar51,auVar43);
      auVar77._0_4_ = (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar33._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar77._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar33._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar77._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar33._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar77._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar33._12_4_;
      auVar77._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar77._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar77._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar77._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar77._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar77._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar77._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar77._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar77._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar77._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar77._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar77._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar50 = vshufps_avx512f(auVar77,auVar77,0xb1);
      auVar50 = vmaxps_avx512f(auVar77,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar33 = vextractf32x4_avx512f(auVar50,2);
      auVar47 = vblendmps_avx512f(auVar51,auVar44);
      auVar78._0_4_ =
           (uint)(bVar13 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar13 & 1) * local_2680._0_4_;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar78._4_4_ = (uint)bVar14 * auVar47._4_4_ | (uint)!bVar14 * local_2680._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar78._8_4_ = (uint)bVar14 * auVar47._8_4_ | (uint)!bVar14 * local_2680._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar78._12_4_ = (uint)bVar14 * auVar47._12_4_ | (uint)!bVar14 * local_2680._12_4_;
      bVar14 = (bool)((byte)(uVar26 >> 4) & 1);
      auVar78._16_4_ = (uint)bVar14 * auVar47._16_4_ | (uint)!bVar14 * local_2680._16_4_;
      bVar14 = (bool)((byte)(uVar26 >> 5) & 1);
      auVar78._20_4_ = (uint)bVar14 * auVar47._20_4_ | (uint)!bVar14 * local_2680._20_4_;
      bVar14 = (bool)((byte)(uVar26 >> 6) & 1);
      auVar78._24_4_ = (uint)bVar14 * auVar47._24_4_ | (uint)!bVar14 * local_2680._24_4_;
      bVar14 = (bool)((byte)(uVar26 >> 7) & 1);
      auVar78._28_4_ = (uint)bVar14 * auVar47._28_4_ | (uint)!bVar14 * local_2680._28_4_;
      auVar78._32_4_ =
           (uint)(bVar15 & 1) * auVar47._32_4_ | (uint)!(bool)(bVar15 & 1) * local_2680._32_4_;
      bVar14 = (bool)((byte)(uVar26 >> 9) & 1);
      auVar78._36_4_ = (uint)bVar14 * auVar47._36_4_ | (uint)!bVar14 * local_2680._36_4_;
      bVar14 = (bool)((byte)(uVar26 >> 10) & 1);
      auVar78._40_4_ = (uint)bVar14 * auVar47._40_4_ | (uint)!bVar14 * local_2680._40_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xb) & 1);
      auVar78._44_4_ = (uint)bVar14 * auVar47._44_4_ | (uint)!bVar14 * local_2680._44_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xc) & 1);
      auVar78._48_4_ = (uint)bVar14 * auVar47._48_4_ | (uint)!bVar14 * local_2680._48_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xd) & 1);
      auVar78._52_4_ = (uint)bVar14 * auVar47._52_4_ | (uint)!bVar14 * local_2680._52_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xe) & 1);
      auVar78._56_4_ = (uint)bVar14 * auVar47._56_4_ | (uint)!bVar14 * local_2680._56_4_;
      bVar14 = SUB81(uVar26 >> 0xf,0);
      auVar78._60_4_ = (uint)bVar14 * auVar47._60_4_ | (uint)!bVar14 * local_2680._60_4_;
      auVar33 = vmaxps_avx(auVar50._0_16_,auVar33);
      auVar50 = vshufps_avx512f(auVar78,auVar78,0xb1);
      auVar50 = vmaxps_avx512f(auVar78,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar34 = vextractf32x4_avx512f(auVar50,2);
      auVar34 = vmaxps_avx(auVar50._0_16_,auVar34);
      auVar33 = vunpcklps_avx(auVar33,auVar34);
      auVar50 = vblendmps_avx512f(auVar51,auVar48);
      auVar53._0_4_ = (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar34._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar34._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar34._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar53._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar34._12_4_;
      auVar53._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar53._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar53._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar53._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar53._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar53._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar53._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar53._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar53._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar53._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar53._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar53._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar50 = vshufps_avx512f(auVar53,auVar53,0xb1);
      auVar50 = vmaxps_avx512f(auVar53,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar34 = vextractf32x4_avx512f(auVar50,2);
      auVar34 = vmaxps_avx(auVar50._0_16_,auVar34);
      auVar33 = vinsertps_avx(auVar33,auVar34,0x28);
      auVar50 = vblendmps_avx512f(auVar49,local_26c0);
      auVar52._0_4_ = (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar34._0_4_
      ;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar52._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar34._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar52._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar34._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar52._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar34._12_4_;
      auVar52._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar52._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar52._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar52._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar52._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar52._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar52._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar52._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar52._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar52._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar52._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar52._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar50 = vshufps_avx512f(auVar52,auVar52,0xb1);
      auVar50 = vminps_avx512f(auVar52,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vminps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar51 = vblendmps_avx512f(auVar51,local_2700);
      auVar60._0_4_ =
           (uint)(bVar13 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM17._0_4_;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar14 * auVar51._4_4_ | (uint)!bVar14 * in_ZMM17._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar14 * auVar51._8_4_ | (uint)!bVar14 * in_ZMM17._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar14 * auVar51._12_4_ | (uint)!bVar14 * in_ZMM17._12_4_;
      bVar14 = (bool)((byte)(uVar26 >> 4) & 1);
      auVar60._16_4_ = (uint)bVar14 * auVar51._16_4_ | (uint)!bVar14 * in_ZMM17._16_4_;
      bVar14 = (bool)((byte)(uVar26 >> 5) & 1);
      auVar60._20_4_ = (uint)bVar14 * auVar51._20_4_ | (uint)!bVar14 * in_ZMM17._20_4_;
      bVar14 = (bool)((byte)(uVar26 >> 6) & 1);
      auVar60._24_4_ = (uint)bVar14 * auVar51._24_4_ | (uint)!bVar14 * in_ZMM17._24_4_;
      bVar14 = (bool)((byte)(uVar26 >> 7) & 1);
      auVar60._28_4_ = (uint)bVar14 * auVar51._28_4_ | (uint)!bVar14 * in_ZMM17._28_4_;
      auVar60._32_4_ =
           (uint)(bVar15 & 1) * auVar51._32_4_ | (uint)!(bool)(bVar15 & 1) * in_ZMM17._32_4_;
      bVar14 = (bool)((byte)(uVar26 >> 9) & 1);
      auVar60._36_4_ = (uint)bVar14 * auVar51._36_4_ | (uint)!bVar14 * in_ZMM17._36_4_;
      bVar14 = (bool)((byte)(uVar26 >> 10) & 1);
      auVar60._40_4_ = (uint)bVar14 * auVar51._40_4_ | (uint)!bVar14 * in_ZMM17._40_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xb) & 1);
      auVar60._44_4_ = (uint)bVar14 * auVar51._44_4_ | (uint)!bVar14 * in_ZMM17._44_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xc) & 1);
      auVar60._48_4_ = (uint)bVar14 * auVar51._48_4_ | (uint)!bVar14 * in_ZMM17._48_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xd) & 1);
      auVar60._52_4_ = (uint)bVar14 * auVar51._52_4_ | (uint)!bVar14 * in_ZMM17._52_4_;
      bVar14 = (bool)((byte)(uVar26 >> 0xe) & 1);
      auVar60._56_4_ = (uint)bVar14 * auVar51._56_4_ | (uint)!bVar14 * in_ZMM17._56_4_;
      bVar14 = SUB81(uVar26 >> 0xf,0);
      auVar60._60_4_ = (uint)bVar14 * auVar51._60_4_ | (uint)!bVar14 * in_ZMM17._60_4_;
      auVar51 = vminps_avx512f(auVar50,auVar47);
      auVar50 = vshufps_avx512f(auVar60,auVar60,0xb1);
      auVar50 = vmaxps_avx512f(auVar60,auVar50);
      auVar47 = vshufpd_avx512f(auVar50,auVar50,0x55);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar47 = vpermpd_avx512f(auVar50,0x4e);
      auVar50 = vmaxps_avx512f(auVar50,auVar47);
      auVar35 = vextractf32x4_avx512f(auVar50,2);
      local_2a00 = vmaxps_avx512vl(auVar50._0_16_,auVar35);
      uVar24 = vcmpps_avx512vl(auVar32,_DAT_01f7aa10,5);
      auVar34 = vblendmps_avx512vl(auVar33,auVar32);
      bVar6 = (byte)uVar24;
      auVar36._0_4_ =
           (float)((uint)(bVar6 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar50._0_4_);
      bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar36._4_4_ = (float)((uint)bVar14 * auVar34._4_4_ | (uint)!bVar14 * auVar50._4_4_);
      bVar14 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar36._8_4_ = (float)((uint)bVar14 * auVar34._8_4_ | (uint)!bVar14 * auVar50._8_4_);
      bVar14 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar36._12_4_ = (float)((uint)bVar14 * auVar34._12_4_ | (uint)!bVar14 * auVar50._12_4_);
      auVar37 = vblendmps_avx512vl(auVar30,auVar31);
      bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar24 >> 2) & 1);
      bVar11 = (bool)((byte)(uVar24 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar24 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar16 = vmovshdup_avx(auVar36);
      uVar25 = (ulong)(auVar16._0_4_ < 0.0) << 5 | 0x40;
      auVar34 = vshufpd_avx(auVar36,auVar36,1);
      uVar28 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x80;
      auVar34 = vextractf32x4_avx512f(auVar51,2);
      auVar34 = vminps_avx(auVar51._0_16_,auVar34);
      auVar38._0_4_ =
           (float)((uint)(bVar6 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar32._0_4_);
      bVar8 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar38._4_4_ = (float)((uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar32._4_4_);
      bVar8 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar38._8_4_ = (float)((uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar32._8_4_);
      bVar8 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar38._12_4_ = (float)((uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar32._12_4_);
      fVar63 = (float)((uint)(bVar6 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar35._0_4_)
               * auVar36._0_4_;
      fVar61 = (float)((uint)(bVar6 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_)
               * auVar38._0_4_;
      uVar24 = (ulong)(auVar36._0_4_ < 0.0) * 0x20;
      local_23c0 = *(ulong *)&pAVar5[1].bounds.bounds0.lower.field_0;
      local_23b8[0] = 0;
      local_2760 = vbroadcastss_avx512vl(auVar36);
      auVar64 = ZEXT3264(local_2760);
      auVar40._4_4_ = fVar63;
      auVar40._0_4_ = fVar63;
      auVar40._8_4_ = fVar63;
      auVar40._12_4_ = fVar63;
      auVar40._16_4_ = fVar63;
      auVar40._20_4_ = fVar63;
      auVar40._24_4_ = fVar63;
      auVar40._28_4_ = fVar63;
      auVar65._8_4_ = 0x80000000;
      auVar65._0_8_ = 0x8000000080000000;
      auVar65._12_4_ = 0x80000000;
      auVar65._16_4_ = 0x80000000;
      auVar65._20_4_ = 0x80000000;
      auVar65._24_4_ = 0x80000000;
      auVar65._28_4_ = 0x80000000;
      local_2780 = vxorps_avx512vl(auVar40,auVar65);
      auVar67 = ZEXT3264(local_2780);
      local_27a0 = vbroadcastsd_avx512vl(auVar16);
      auVar68 = ZEXT3264(local_27a0);
      auVar41._8_4_ = 1;
      auVar41._0_8_ = 0x100000001;
      auVar41._12_4_ = 1;
      auVar41._16_4_ = 1;
      auVar41._20_4_ = 1;
      auVar41._24_4_ = 1;
      auVar41._28_4_ = 1;
      auVar40 = ZEXT1632(CONCAT412((float)((uint)bVar11 * auVar37._12_4_ |
                                          (uint)!bVar11 * auVar35._12_4_) * auVar36._12_4_,
                                   CONCAT48((float)((uint)bVar9 * auVar37._8_4_ |
                                                   (uint)!bVar9 * auVar35._8_4_) * auVar36._8_4_,
                                            CONCAT44((float)((uint)bVar14 * auVar37._4_4_ |
                                                            (uint)!bVar14 * auVar35._4_4_) *
                                                     auVar36._4_4_,fVar63))));
      auVar39 = vpermps_avx2(auVar41,auVar40);
      local_27c0 = vxorps_avx512vl(auVar39,auVar65);
      auVar69 = ZEXT3264(local_27c0);
      auVar66._8_4_ = 2;
      auVar66._0_8_ = 0x200000002;
      auVar66._12_4_ = 2;
      auVar66._16_4_ = 2;
      auVar66._20_4_ = 2;
      auVar66._24_4_ = 2;
      auVar66._28_4_ = 2;
      local_27e0 = vpermps_avx512vl(auVar66,ZEXT1632(auVar36));
      auVar70 = ZEXT3264(local_27e0);
      auVar39 = vpermps_avx2(auVar66,auVar40);
      local_2800 = vxorps_avx512vl(auVar39,auVar65);
      auVar71 = ZEXT3264(local_2800);
      local_2820 = vbroadcastss_avx512vl(auVar38);
      auVar72 = ZEXT3264(local_2820);
      auVar39._4_4_ = fVar61;
      auVar39._0_4_ = fVar61;
      auVar39._8_4_ = fVar61;
      auVar39._12_4_ = fVar61;
      auVar39._16_4_ = fVar61;
      auVar39._20_4_ = fVar61;
      auVar39._24_4_ = fVar61;
      auVar39._28_4_ = fVar61;
      local_2840 = vxorps_avx512vl(auVar39,auVar65);
      auVar73 = ZEXT3264(local_2840);
      local_2860 = vpermps_avx512vl(auVar41,ZEXT1632(auVar38));
      auVar74 = ZEXT3264(local_2860);
      auVar40 = ZEXT1632(CONCAT412((float)((uint)bVar12 * auVar30._12_4_ |
                                          (uint)!bVar12 * auVar31._12_4_) * auVar38._12_4_,
                                   CONCAT48((float)((uint)bVar10 * auVar30._8_4_ |
                                                   (uint)!bVar10 * auVar31._8_4_) * auVar38._8_4_,
                                            CONCAT44((float)((uint)bVar7 * auVar30._4_4_ |
                                                            (uint)!bVar7 * auVar31._4_4_) *
                                                     auVar38._4_4_,fVar61))));
      auVar39 = vpermps_avx2(auVar41,auVar40);
      auVar51 = ZEXT3264(auVar39);
      local_2880 = vxorps_avx512vl(auVar39,auVar65);
      auVar75 = ZEXT3264(local_2880);
      local_28a0 = vpermps_avx512vl(auVar66,ZEXT1632(auVar38));
      auVar76 = ZEXT3264(local_28a0);
      auVar39 = vpermps_avx2(auVar66,auVar40);
      local_28c0 = vxorps_avx512vl(auVar39,auVar65);
      auVar77 = ZEXT3264(local_28c0);
      local_28e0 = vbroadcastss_avx512vl(auVar34);
      auVar78 = ZEXT3264(local_28e0);
      auVar50 = vpbroadcastd_avx512f(ZEXT416(0x7f800000));
      auVar50 = vpblendmd_avx512f(auVar50,local_26c0);
      auVar54._0_4_ =
           (uint)(bVar13 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar13 & 1) * (int)auVar38._0_4_;
      bVar14 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * (int)auVar38._4_4_;
      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * (int)auVar38._8_4_;
      bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar54._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * (int)auVar38._12_4_;
      auVar54._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar50._16_4_;
      auVar54._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar50._20_4_;
      auVar54._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar50._24_4_;
      auVar54._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar50._28_4_;
      auVar54._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
      auVar54._36_4_ = (uint)((byte)(uVar26 >> 9) & 1) * auVar50._36_4_;
      auVar54._40_4_ = (uint)((byte)(uVar26 >> 10) & 1) * auVar50._40_4_;
      auVar54._44_4_ = (uint)((byte)(uVar26 >> 0xb) & 1) * auVar50._44_4_;
      auVar54._48_4_ = (uint)((byte)(uVar26 >> 0xc) & 1) * auVar50._48_4_;
      auVar54._52_4_ = (uint)((byte)(uVar26 >> 0xd) & 1) * auVar50._52_4_;
      auVar54._56_4_ = (uint)((byte)(uVar26 >> 0xe) & 1) * auVar50._56_4_;
      auVar54._60_4_ = (uint)(byte)(uVar26 >> 0xf) * auVar50._60_4_;
      auVar39 = vbroadcastss_avx512vl(local_2a00);
      auVar47 = ZEXT3264(auVar39);
      auVar50 = vmovdqa64_avx512f(auVar54);
      puVar19 = local_23b0;
      local_2440 = vmovdqa64_avx512f(auVar54);
      do {
        auVar53 = vbroadcastss_avx512f(ZEXT416((uint)puVar19[-1]));
        puVar19 = puVar19 + -2;
        uVar17 = vcmpps_avx512f(auVar53,auVar60,1);
        if ((short)uVar17 != 0) {
          uVar26 = *puVar19;
          while ((uVar26 & 8) == 0) {
            auVar39 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar24),auVar67._0_32_,
                                 auVar64._0_32_);
            auVar40 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar25),auVar69._0_32_,
                                 auVar68._0_32_);
            auVar39 = vpmaxsd_avx2(auVar39,auVar40);
            auVar40 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar28),auVar71._0_32_,
                                 auVar70._0_32_);
            auVar40 = vpmaxsd_avx512vl(auVar40,auVar78._0_32_);
            auVar39 = vpmaxsd_avx2(auVar39,auVar40);
            auVar40 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar24 ^ 0x20)),
                                 auVar73._0_32_,auVar72._0_32_);
            auVar41 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar25 ^ 0x20)),
                                 auVar75._0_32_,auVar74._0_32_);
            auVar40 = vpminsd_avx2(auVar40,auVar41);
            auVar41 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar28 ^ 0x20)),
                                 auVar77._0_32_,auVar76._0_32_);
            auVar41 = vpminsd_avx2(auVar41,auVar47._0_32_);
            auVar40 = vpminsd_avx2(auVar40,auVar41);
            auVar51 = ZEXT3264(auVar40);
            local_29a0.valid = (int *)auVar39._0_8_;
            local_29a0.geometryUserPtr = (void *)auVar39._8_8_;
            local_29a0.primID = auVar39._16_4_;
            local_29a0._20_4_ = auVar39._20_4_;
            local_29a0.context = (RTCRayQueryContext *)auVar39._24_8_;
            uVar23 = vcmpps_avx512vl(auVar39,auVar40,2);
            if ((char)uVar23 == '\0') goto LAB_00867a86;
            uVar22 = 0;
            uVar29 = 8;
            auVar52 = auVar49;
            do {
              lVar21 = 0;
              for (uVar27 = uVar23; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                lVar21 = lVar21 + 1;
              }
              auVar51 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar26 + 0x40 + lVar21 * 4)));
              auVar51 = vfmadd132ps_avx512f(auVar51,auVar45,auVar43);
              auVar53 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar26 + 0x80 + lVar21 * 4)));
              auVar53 = vfmadd132ps_avx512f(auVar53,auVar46,auVar44);
              auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar26 + 0xc0 + lVar21 * 4)));
              auVar54 = vfmadd132ps_avx512f(auVar54,auVar42,auVar48);
              auVar55 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar26 + 0x60 + lVar21 * 4)));
              auVar55 = vfmadd132ps_avx512f(auVar55,auVar45,auVar43);
              auVar56 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar26 + 0xa0 + lVar21 * 4)));
              auVar56 = vfmadd132ps_avx512f(auVar56,auVar46,auVar44);
              auVar57 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar26 + 0xe0 + lVar21 * 4)));
              auVar57 = vfmadd132ps_avx512f(auVar57,auVar42,auVar48);
              auVar58 = vminps_avx512f(auVar51,auVar55);
              auVar59 = vminps_avx512f(auVar53,auVar56);
              auVar58 = vpmaxsd_avx512f(auVar58,auVar59);
              auVar59 = vminps_avx512f(auVar54,auVar57);
              auVar59 = vpmaxsd_avx512f(auVar59,auVar50);
              auVar58 = vpmaxsd_avx512f(auVar58,auVar59);
              auVar51 = vmaxps_avx512f(auVar51,auVar55);
              auVar53 = vmaxps_avx512f(auVar53,auVar56);
              auVar51 = vpminsd_avx512f(auVar51,auVar53);
              auVar53 = vmaxps_avx512f(auVar54,auVar57);
              auVar53 = vpminsd_avx512f(auVar53,auVar60);
              auVar51 = vpminsd_avx512f(auVar51,auVar53);
              uVar17 = vpcmpd_avx512f(auVar58,auVar51,2);
              uVar27 = uVar29;
              auVar53 = auVar52;
              if ((short)uVar17 != 0) {
                auVar51 = vbroadcastss_avx512f
                                    (ZEXT416(*(uint *)((long)&local_29a0.valid + lVar21 * 4)));
                uVar27 = *(ulong *)(uVar26 + lVar21 * 8);
                uVar17 = vcmpps_avx512f(auVar51,auVar52,1);
                if ((short)uVar17 == 0) {
                  *puVar19 = uVar27;
                  uVar62 = auVar51._0_4_;
                  uVar27 = uVar29;
                }
                else {
                  auVar53 = auVar51;
                  if (uVar29 == 8) goto LAB_0086774e;
                  *puVar19 = uVar29;
                  uVar62 = auVar52._0_4_;
                  auVar52 = auVar51;
                }
                uVar22 = uVar22 + 1;
                *(undefined4 *)(puVar19 + 1) = uVar62;
                puVar19 = puVar19 + 2;
                auVar53 = auVar52;
              }
LAB_0086774e:
              uVar23 = uVar23 - 1 & uVar23;
              uVar29 = uVar27;
              auVar52 = auVar53;
            } while (uVar23 != 0);
            if (uVar27 == 8) goto LAB_00867a86;
            uVar26 = uVar27;
            if (1 < uVar22) {
              pauVar1 = (undefined1 (*) [16])(puVar19 + -4);
              puVar2 = puVar19 + -2;
              if ((uint)puVar19[-3] < (uint)puVar19[-1]) {
                auVar30 = *pauVar1;
                auVar51 = ZEXT1664(auVar30);
                local_2940._0_16_ = auVar30;
                auVar52 = local_2940;
                *(int *)(puVar19 + -3) = (int)puVar19[-1];
                *(ulong *)*pauVar1 = *puVar2;
                local_2940._0_8_ = auVar30._0_8_;
                *puVar2 = local_2940._0_8_;
                local_2940._8_4_ = auVar30._8_4_;
                *(undefined4 *)(puVar19 + -1) = local_2940._8_4_;
                local_2940 = auVar52;
              }
              if (uVar22 != 2) {
                pauVar3 = (undefined1 (*) [16])(puVar19 + -6);
                uVar4 = (uint)puVar19[-5];
                if (uVar4 < (uint)puVar19[-1]) {
                  auVar30 = *pauVar3;
                  auVar51 = ZEXT1664(auVar30);
                  local_2940._0_16_ = auVar30;
                  auVar52 = local_2940;
                  *(int *)(puVar19 + -5) = (int)puVar19[-1];
                  *(ulong *)*pauVar3 = *puVar2;
                  local_2940._0_8_ = auVar30._0_8_;
                  *puVar2 = local_2940._0_8_;
                  local_2940._8_4_ = auVar30._8_4_;
                  *(undefined4 *)(puVar19 + -1) = local_2940._8_4_;
                  uVar4 = (uint)puVar19[-5];
                  local_2940 = auVar52;
                }
                if (uVar4 < (uint)puVar19[-3]) {
                  auVar30 = *pauVar3;
                  auVar51 = ZEXT1664(auVar30);
                  local_2940._0_16_ = auVar30;
                  auVar52 = local_2940;
                  *(int *)(puVar19 + -5) = (int)puVar19[-3];
                  *(undefined8 *)*pauVar3 = *(undefined8 *)*pauVar1;
                  local_2940._0_8_ = auVar30._0_8_;
                  *(undefined8 *)*pauVar1 = local_2940._0_8_;
                  local_2940._8_4_ = auVar30._8_4_;
                  *(undefined4 *)(puVar19 + -3) = local_2940._8_4_;
                  local_2940 = auVar52;
                }
              }
            }
          }
          uVar23 = vcmpps_avx512f(auVar60,auVar53,6);
          if ((short)uVar23 != 0) {
            uVar22 = (ulong)((uint)uVar26 & 0xf);
            uVar29 = uVar23;
            if (uVar22 != 8) {
              lVar21 = 0;
              local_2400 = auVar60;
              do {
                local_29a0.geomID = *(uint *)((uVar26 & 0xfffffffffffffff0) + lVar21 * 8);
                local_2970 = (context->scene->geometries).items[local_29a0.geomID].ptr;
                auVar47 = vpbroadcastd_avx512f(ZEXT416(local_2970->mask));
                uVar27 = vptestmd_avx512f(auVar47,*(undefined1 (*) [64])(ray + 0x240));
                if ((short)(uVar29 & uVar27) != 0) {
                  auVar42 = vpmovm2d_avx512dq(uVar29 & uVar27);
                  local_2940 = vmovdqa64_avx512f(auVar42);
                  local_29a0.geometryUserPtr = local_2970->userPtr;
                  local_29a0.valid = (int *)local_2940;
                  auVar30 = (undefined1  [16])local_29a0._0_16_;
                  local_29a0.context = context->user;
                  local_29a0.N = 0x10;
                  local_29a0.primID =
                       *(undefined4 *)((uVar26 & 0xfffffffffffffff0) + 4 + lVar21 * 8);
                  local_29a0._0_20_ = CONCAT416(local_29a0.primID,auVar30);
                  local_2968 = 0;
                  local_2960 = context->args;
                  pp_Var18 = (_func_int **)local_2960->intersect;
                  if (pp_Var18 == (_func_int **)0x0) {
                    pp_Var18 = local_2970[1].super_RefCount._vptr_RefCount;
                  }
                  auVar51 = ZEXT1664(auVar51._0_16_);
                  local_29a0.rayhit = (RTCRayHitN *)ray;
                  (*(code *)pp_Var18)(&local_29a0);
                  auVar49 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar64 = ZEXT3264(local_2760);
                  auVar67 = ZEXT3264(local_2780);
                  auVar68 = ZEXT3264(local_27a0);
                  auVar69 = ZEXT3264(local_27c0);
                  auVar70 = ZEXT3264(local_27e0);
                  auVar71 = ZEXT3264(local_2800);
                  auVar72 = ZEXT3264(local_2820);
                  auVar73 = ZEXT3264(local_2840);
                  auVar74 = ZEXT3264(local_2860);
                  auVar75 = ZEXT3264(local_2880);
                  auVar76 = ZEXT3264(local_28a0);
                  auVar77 = ZEXT3264(local_28c0);
                  auVar78 = ZEXT3264(local_28e0);
                  auVar50 = vmovdqa64_avx512f(local_2440);
                  uVar29 = uVar23 & 0xffff;
                  auVar42 = local_25c0;
                  auVar43 = local_2480;
                  auVar44 = local_24c0;
                  auVar48 = local_2500;
                  auVar45 = local_2540;
                  auVar46 = local_2580;
                  auVar60 = local_2400;
                }
                lVar21 = lVar21 + 1;
              } while (uVar22 - 8 != lVar21);
            }
            auVar47 = *(undefined1 (*) [64])(ray + 0x200);
            uVar17 = vcmpps_avx512f(auVar47,auVar60,1);
            if ((ushort)((ushort)uVar17 & (ushort)uVar29) != 0) {
              bVar14 = (bool)((byte)uVar29 & 1);
              auVar55._0_4_ = (uint)bVar14 * auVar47._0_4_ | (uint)!bVar14 * auVar60._0_4_;
              bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
              auVar55._4_4_ = (uint)bVar14 * auVar47._4_4_ | (uint)!bVar14 * auVar60._4_4_;
              bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
              auVar55._8_4_ = (uint)bVar14 * auVar47._8_4_ | (uint)!bVar14 * auVar60._8_4_;
              bVar14 = (bool)((byte)(uVar29 >> 3) & 1);
              auVar55._12_4_ = (uint)bVar14 * auVar47._12_4_ | (uint)!bVar14 * auVar60._12_4_;
              bVar14 = (bool)((byte)(uVar29 >> 4) & 1);
              auVar55._16_4_ = (uint)bVar14 * auVar47._16_4_ | (uint)!bVar14 * auVar60._16_4_;
              bVar14 = (bool)((byte)(uVar29 >> 5) & 1);
              auVar55._20_4_ = (uint)bVar14 * auVar47._20_4_ | (uint)!bVar14 * auVar60._20_4_;
              bVar14 = (bool)((byte)(uVar29 >> 6) & 1);
              auVar55._24_4_ = (uint)bVar14 * auVar47._24_4_ | (uint)!bVar14 * auVar60._24_4_;
              bVar14 = (bool)((byte)(uVar29 >> 7) & 1);
              auVar55._28_4_ = (uint)bVar14 * auVar47._28_4_ | (uint)!bVar14 * auVar60._28_4_;
              bVar14 = (bool)((byte)(uVar29 >> 8) & 1);
              auVar55._32_4_ = (uint)bVar14 * auVar47._32_4_ | (uint)!bVar14 * auVar60._32_4_;
              bVar14 = (bool)((byte)(uVar29 >> 9) & 1);
              auVar55._36_4_ = (uint)bVar14 * auVar47._36_4_ | (uint)!bVar14 * auVar60._36_4_;
              bVar14 = (bool)((byte)(uVar29 >> 10) & 1);
              auVar55._40_4_ = (uint)bVar14 * auVar47._40_4_ | (uint)!bVar14 * auVar60._40_4_;
              bVar14 = (bool)((byte)(uVar29 >> 0xb) & 1);
              auVar55._44_4_ = (uint)bVar14 * auVar47._44_4_ | (uint)!bVar14 * auVar60._44_4_;
              bVar14 = (bool)((byte)(uVar29 >> 0xc) & 1);
              auVar55._48_4_ = (uint)bVar14 * auVar47._48_4_ | (uint)!bVar14 * auVar60._48_4_;
              bVar14 = (bool)((byte)(uVar29 >> 0xd) & 1);
              auVar55._52_4_ = (uint)bVar14 * auVar47._52_4_ | (uint)!bVar14 * auVar60._52_4_;
              bVar14 = (bool)((byte)(uVar29 >> 0xe) & 1);
              auVar55._56_4_ = (uint)bVar14 * auVar47._56_4_ | (uint)!bVar14 * auVar60._56_4_;
              bVar14 = SUB81(uVar29 >> 0xf,0);
              auVar55._60_4_ = (uint)bVar14 * auVar47._60_4_ | (uint)!bVar14 * auVar60._60_4_;
              auVar47 = vshufps_avx512f(auVar55,auVar55,0xb1);
              auVar47 = vmaxps_avx512f(auVar55,auVar47);
              auVar60 = vshufpd_avx512f(auVar47,auVar47,0x55);
              auVar47 = vmaxps_avx512f(auVar47,auVar60);
              auVar60 = vpermpd_avx512f(auVar47,0x4e);
              auVar47 = vmaxps_avx512f(auVar47,auVar60);
              auVar30 = vextractf32x4_avx512f(auVar47,2);
              local_2a00 = vmaxss_avx(auVar47._0_16_,auVar30);
              auVar60 = auVar55;
            }
          }
        }
        uVar62 = local_2a00._0_4_;
        auVar47 = ZEXT3264(CONCAT428(uVar62,CONCAT424(uVar62,CONCAT420(uVar62,CONCAT416(uVar62,
                                                  CONCAT412(uVar62,CONCAT48(uVar62,CONCAT44(uVar62,
                                                  uVar62))))))));
LAB_00867a86:
      } while (puVar19 != &local_23c0);
      in_ZMM17 = auVar60;
    } while (uVar20 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf16 operator ==(const vint16& a, const vint16& b) { return _mm512_cmp_epi32_mask(a,b,_MM_CMPINT_EQ); }